

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O0

void __thiscall
DRAG<TTA>::PerformLabelingMem
          (DRAG<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2c8;
  allocator<unsigned_long> local_261;
  value_type_conflict2 local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  int local_240;
  int local_23c;
  int c_i;
  int r_i;
  int c_1;
  int r_1;
  int c;
  int r;
  int h;
  int w;
  undefined1 local_218 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_140;
  undefined1 local_e0 [8];
  MemMat<unsigned_char> img;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  DRAG<TTA> *this_local;
  
  img.accesses_._88_8_ = accesses;
  cv::Mat_<unsigned_char>::Mat_(&local_140,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e0,&local_140);
  cv::Mat_<unsigned_char>::~Mat_(&local_140);
  cv::MatSize::operator()((MatSize *)&h);
  MemMat<int>::MemMat((MemMat<int> *)local_218,(Size *)&h,0);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  TTA::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                + 1);
  TTA::MemSetup();
  r = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  c = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  r_1 = 0;
  c_1 = -1;
  while (c_1 = c_1 + 1, c_1 < r) {
    puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_1,c_1);
    if (*puVar5 != '\0') {
      uVar4 = TTA::MemNewLabel();
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_1,c_1);
      *puVar7 = uVar4;
      while( true ) {
        c_1 = c_1 + 1;
        if (r <= c_1) goto LAB_00139e6e;
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_1,c_1);
        if (*puVar5 == '\0') break;
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_1,c_1 + -1);
        iVar1 = *piVar6;
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_1,c_1);
        *piVar6 = iVar1;
      }
    }
  }
LAB_00139e6e:
  r_i = 1;
  do {
    if (c <= r_i) {
      uVar4 = TTA::MemFlatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
      for (local_23c = 0; local_23c < (int)local_218._0_4_; local_23c = local_23c + 1) {
        for (local_240 = 0; local_240 < (int)local_218._4_4_; local_240 = local_240 + 1) {
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,local_23c,local_240);
          uVar4 = TTA::MemGetLabel(*puVar7);
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,local_23c,local_240);
          *puVar7 = uVar4;
        }
      }
      local_260 = 0;
      std::allocator<unsigned_long>::allocator(&local_261);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_258,4,&local_260,&local_261);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                 &local_258);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_258);
      std::allocator<unsigned_long>::~allocator(&local_261);
      dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e0);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          img.accesses_._88_8_,0);
      *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
      dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_218);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          img.accesses_._88_8_,1);
      *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
      dVar9 = TTA::MemTotalAccesses();
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          img.accesses_._88_8_,2);
      *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
      MemMat<int>::GetImage(&local_2c8,(MemMat<int> *)local_218);
      cv::Mat_<int>::operator=
                ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2c8);
      cv::Mat_<int>::~Mat_(&local_2c8);
      TTA::MemDealloc();
      MemMat<int>::~MemMat((MemMat<int> *)local_218);
      MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e0);
      return;
    }
    c_i = 0;
    if (r == 1) {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,0);
      if (*puVar5 != '\0') {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *puVar7 = uVar4;
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *piVar6 = iVar1;
        }
      }
    }
    else {
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,0);
      if (*puVar5 == '\0') goto LAB_0013a3cc;
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
      if (*puVar5 == '\0') {
        puVar5 = MemMat<unsigned_char>::operator()
                           ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + 1);
        if (*puVar5 == '\0') {
          uVar4 = TTA::MemNewLabel();
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *puVar7 = uVar4;
          goto LAB_0013a27a;
        }
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + 1);
        iVar1 = *piVar6;
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
        *piVar6 = iVar1;
        goto LAB_0013a1dc;
      }
      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
      iVar1 = *piVar6;
      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
      *piVar6 = iVar1;
LAB_0013a010:
      c_i = c_i + 1;
      if (c_i < r + -1) {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,c_i);
        if (*puVar5 == '\0') goto LAB_0013a3cc;
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
        if (*puVar5 == '\0') {
          puVar5 = MemMat<unsigned_char>::operator()
                             ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + 1);
          if (*puVar5 == '\0') {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
            *piVar6 = iVar1;
            goto LAB_0013a27a;
          }
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
          uVar4 = *puVar7;
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + 1);
          uVar4 = TTA::MemMerge(uVar4,*puVar7);
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *puVar7 = uVar4;
LAB_0013a1dc:
          do {
            c_i = c_i + 1;
            if (r + -1 <= c_i) {
              puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,c_i);
              if (*puVar5 != '\0') {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                *piVar6 = iVar1;
              }
              goto LAB_0013aaae;
            }
            puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,c_i);
            if (*puVar5 != '\0') {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
              *piVar6 = iVar1;
              goto LAB_0013a010;
            }
LAB_0013a3cc:
            while( true ) {
              do {
                c_i = c_i + 1;
                if (r + -1 <= c_i) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r_i,c_i);
                  if (*puVar5 != '\0') {
                    puVar5 = MemMat<unsigned_char>::operator()
                                       ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
                    if (*puVar5 == '\0') {
                      puVar5 = MemMat<unsigned_char>::operator()
                                         ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + -1);
                      if (*puVar5 == '\0') {
                        uVar4 = TTA::MemNewLabel();
                        puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                        *puVar7 = uVar4;
                      }
                      else {
                        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + -1)
                        ;
                        iVar1 = *piVar6;
                        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                        *piVar6 = iVar1;
                      }
                    }
                    else {
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
                      iVar1 = *piVar6;
                      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                      *piVar6 = iVar1;
                    }
                  }
                  goto LAB_0013aaae;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r_i,c_i);
              } while (*puVar5 == '\0');
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
              if (*puVar5 != '\0') {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                *piVar6 = iVar1;
                goto LAB_0013a010;
              }
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + 1);
              if (*puVar5 != '\0') break;
              puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + -1);
              if (*puVar5 == '\0') {
                uVar4 = TTA::MemNewLabel();
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                *puVar7 = uVar4;
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + -1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                *piVar6 = iVar1;
              }
LAB_0013a27a:
              while( true ) {
                c_i = c_i + 1;
                if (r + -1 <= c_i) {
                  puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,r_i,c_i);
                  if (*puVar5 != '\0') {
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
                    iVar1 = *piVar6;
                    piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                    *piVar6 = iVar1;
                  }
                  goto LAB_0013aaae;
                }
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r_i,c_i);
                if (*puVar5 == '\0') break;
                puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + 1);
                if (*puVar5 != '\0') {
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
                  uVar4 = *puVar7;
                  puVar7 = (uint *)MemMat<int>::operator()
                                             ((MemMat<int> *)local_218,r_i + -1,c_i + 1);
                  uVar4 = TTA::MemMerge(uVar4,*puVar7);
                  puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                  *puVar7 = uVar4;
                  goto LAB_0013a1dc;
                }
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
                *piVar6 = iVar1;
              }
            }
            puVar5 = MemMat<unsigned_char>::operator()
                               ((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i + -1);
            if (*puVar5 == '\0') {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
              *piVar6 = iVar1;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + -1);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i + 1);
              uVar4 = TTA::MemMerge(uVar4,*puVar7);
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
              *puVar7 = uVar4;
            }
          } while( true );
        }
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
        iVar1 = *piVar6;
        piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
        *piVar6 = iVar1;
        goto LAB_0013a010;
      }
      puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i,c_i);
      if (*puVar5 != '\0') {
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,r_i + -1,c_i);
        if (*puVar5 == '\0') {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i + -1);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *piVar6 = iVar1;
        }
        else {
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i + -1,c_i);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,r_i,c_i);
          *piVar6 = iVar1;
        }
      }
    }
LAB_0013aaae:
    r_i = r_i + 1;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }